

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O2

void __thiscall Dependency::Dependency(Dependency *this,string *path,string *dependent_file)

{
  string *prefix;
  size_type sVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  undefined8 extraout_RDX_01;
  Settings *this_00;
  string search_path;
  string original_file;
  string local_1078;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058;
  char original_file_buffer [4096];
  
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  (this->prefix)._M_dataplus._M_p = (pointer)&(this->prefix).field_2;
  (this->prefix)._M_string_length = 0;
  prefix = &this->prefix;
  (this->prefix).field_2._M_local_buf[0] = '\0';
  (this->symlinks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->symlinks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->symlinks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->new_name)._M_dataplus._M_p = (pointer)&(this->new_name).field_2;
  (this->new_name)._M_string_length = 0;
  (this->new_name).field_2._M_local_buf[0] = '\0';
  original_file._M_dataplus._M_p = (pointer)&original_file.field_2;
  original_file._M_string_length = 0;
  original_file.field_2._M_local_buf[0] = '\0';
  rtrim(path);
  bVar2 = isRpath(path);
  if (bVar2) {
    searchFilenameInRpaths(&search_path,path,dependent_file);
    std::__cxx11::string::operator=((string *)&original_file,(string *)&search_path);
    std::__cxx11::string::~string((string *)&search_path);
  }
  else {
    rtrim(path);
    pcVar4 = realpath((path->_M_dataplus)._M_p,original_file_buffer);
    if (pcVar4 == (char *)0x0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"\n/!\\ WARNING : Cannot resolve path \'");
      poVar5 = std::operator<<(poVar5,(path->_M_dataplus)._M_p);
      poVar5 = std::operator<<(poVar5,"\'");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::_M_assign((string *)&original_file);
    }
    else {
      std::__cxx11::string::assign((char *)&original_file);
    }
  }
  bVar2 = std::operator!=(&original_file,path);
  if (bVar2) {
    addSymlink(this,path);
  }
  std::__cxx11::string::string((string *)&local_1078,(string *)&original_file);
  stripPrefix(&search_path,&local_1078);
  std::__cxx11::string::operator=((string *)this,(string *)&search_path);
  std::__cxx11::string::~string((string *)&search_path);
  std::__cxx11::string::~string((string *)&local_1078);
  std::__cxx11::string::rfind((char *)&original_file,0x1197f5);
  std::__cxx11::string::substr((ulong)&search_path,(ulong)&original_file);
  std::__cxx11::string::operator=((string *)prefix,(string *)&search_path);
  std::__cxx11::string::~string((string *)&search_path);
  sVar1 = (this->prefix)._M_string_length;
  if ((sVar1 != 0) && ((prefix->_M_dataplus)._M_p[sVar1 - 1] != '/')) {
    std::__cxx11::string::append((char *)prefix);
  }
  bVar2 = Settings::isPrefixBundled(prefix);
  if (!bVar2) goto LAB_0010611e;
  if ((this->prefix)._M_string_length == 0) {
LAB_00105f9e:
    iVar3 = Settings::searchPathAmount();
    uVar6 = extraout_RDX;
    if (iVar3 == 0) {
      initSearchPaths();
      iVar3 = Settings::searchPathAmount();
      uVar6 = extraout_RDX_00;
    }
    this_00 = (Settings *)0x0;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    for (; iVar3 != (int)this_00; this_00 = (Settings *)(ulong)((int)this_00 + 1)) {
      Settings::searchPath_abi_cxx11_(&search_path,this_00,(int)uVar6);
      std::operator+(&local_1058,&search_path,&this->filename);
      bVar2 = fileExists(&local_1058);
      std::__cxx11::string::~string((string *)&local_1058);
      if (bVar2) {
        poVar5 = std::operator<<((ostream *)&std::cout,"FOUND ");
        poVar5 = std::operator<<(poVar5,(string *)this);
        poVar5 = std::operator<<(poVar5," in ");
        poVar5 = std::operator<<(poVar5,(string *)&search_path);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::string::_M_assign((string *)prefix);
        missing_prefixes = true;
        std::__cxx11::string::~string((string *)&search_path);
        break;
      }
      std::__cxx11::string::~string((string *)&search_path);
      uVar6 = extraout_RDX_01;
    }
  }
  else {
    std::operator+(&search_path,prefix,&this->filename);
    bVar2 = fileExists(&search_path);
    std::__cxx11::string::~string((string *)&search_path);
    if (!bVar2) goto LAB_00105f9e;
  }
  bVar2 = Settings::isPrefixIgnored(prefix);
  if (!bVar2) {
    if ((this->prefix)._M_string_length != 0) {
      std::operator+(&search_path,prefix,&this->filename);
      bVar2 = fileExists(&search_path);
      std::__cxx11::string::~string((string *)&search_path);
      if (bVar2) goto LAB_00106111;
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"\n/!\\ WARNING : Library ");
    poVar5 = std::operator<<(poVar5,(string *)this);
    poVar5 = std::operator<<(poVar5," has an incomplete name (location unknown)");
    std::endl<char,std::char_traits<char>>(poVar5);
    missing_prefixes = true;
    getUserInputDirForFile(&search_path,&this->filename);
    Settings::addSearchPath(&search_path);
    std::__cxx11::string::~string((string *)&search_path);
  }
LAB_00106111:
  std::__cxx11::string::_M_assign((string *)&this->new_name);
LAB_0010611e:
  std::__cxx11::string::~string((string *)&original_file);
  return;
}

Assistant:

Dependency::Dependency(std::string path, const std::string& dependent_file)
{
    char original_file_buffer[PATH_MAX];
    std::string original_file;

    rtrim(path);
    if (isRpath(path))
    {
        original_file = searchFilenameInRpaths(path, dependent_file);
    }
    else if (realpath(rtrim(path).c_str(), original_file_buffer))
    {
        original_file = original_file_buffer;
    }
    else
    {
        std::cerr << "\n/!\\ WARNING : Cannot resolve path '" << path.c_str() << "'" << std::endl;
        original_file = path;
    }

    // check if given path is a symlink
    if (original_file != path) addSymlink(path);

    filename = stripPrefix(original_file);
    prefix = original_file.substr(0, original_file.rfind("/")+1);
    
    if( !prefix.empty() && prefix[ prefix.size()-1 ] != '/' ) prefix += "/";

    // check if this dependency is in /usr/lib, /System/Library, or in ignored list
    if (!Settings::isPrefixBundled(prefix)) return;

    // check if the lib is in a known location
    if( prefix.empty() || !fileExists( prefix+filename ) )
    {
        //the paths contains at least /usr/lib so if it is empty we have not initialized it
        int searchPathAmount = Settings::searchPathAmount();
        if( searchPathAmount == 0 )
        {
            initSearchPaths();
            searchPathAmount = Settings::searchPathAmount();
        }
        
        //check if file is contained in one of the paths
        for( int i=0; i<searchPathAmount; ++i)
        {
            std::string search_path = Settings::searchPath(i);
            if (fileExists( search_path+filename ))
            {
                std::cout << "FOUND " << filename << " in " << search_path << std::endl;
                prefix = search_path;
                missing_prefixes = true; //the prefix was missing
                break;
            }
        }
    }
    
    //If the location is still unknown, ask the user for search path
    if( !Settings::isPrefixIgnored(prefix)
        && ( prefix.empty() || !fileExists( prefix+filename ) ) )
    {
        std::cerr << "\n/!\\ WARNING : Library " << filename << " has an incomplete name (location unknown)" << std::endl;
        missing_prefixes = true;

        Settings::addSearchPath(getUserInputDirForFile(filename));
    }

    new_name = filename;
}